

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall slang::ast::Scope::addMembers(Scope *this,SyntaxNode *syntax)

{
  Token *this_00;
  SyntaxKind SVar1;
  Compilation *pCVar2;
  pointer ppVVar3;
  bool bVar4;
  uint *puVar5;
  DeferredMemberData *pDVar6;
  ConfigBlockSymbol *symbol;
  PackageImportItemSyntax *pPVar7;
  ExplicitImportSymbol *pEVar8;
  SourceLocation SVar9;
  string_view *psVar10;
  ForwardingTypedefSymbol *symbol_00;
  CovergroupType *symbol_01;
  ulong uVar11;
  ElabSystemTaskSyntax *in_RDX;
  ElabSystemTaskSyntax *extraout_RDX;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> *__range3;
  SyntaxNode *pSVar12;
  ParameterDeclarationStatementSyntax *syntax_00;
  long lVar13;
  PackageImportDeclarationSyntax *importDecl;
  long lVar14;
  pair<slang::ast::SubroutineSymbol_*,_bool> pVar15;
  Token TVar16;
  LookupLocation location;
  SmallVector<slang::ast::VariableSymbol_*,_5UL> symbols;
  string_view local_68;
  ulong local_58;
  SourceLocation local_50;
  string_view local_48;
  SyntaxNode *local_38;
  
  pSVar12 = syntax->previewNode;
  if (pSVar12 != (SyntaxNode *)0x0) {
    addMembers(this,pSVar12);
    in_RDX = extraout_RDX;
  }
  SVar1 = syntax->kind;
  puVar5 = &switchD_0036f558::switchdataD_004ae9d4;
  switch(SVar1) {
  case CheckerDataDeclaration:
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
         (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
    syntax = *(SyntaxNode **)(syntax + 4);
    VariableSymbol::fromSyntax
              (this->compilation,(DataDeclarationSyntax *)syntax,this,true,
               &symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>);
    ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
    lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
    for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
      syntax = *(SyntaxNode **)((long)ppVVar3 + lVar13);
      addMember(this,(Symbol *)syntax);
    }
    goto LAB_0036fe7f;
  case CheckerDeclaration:
    symbol = (ConfigBlockSymbol *)CheckerSymbol::fromSyntax(this,(CheckerDeclarationSyntax *)syntax)
    ;
    break;
  case CheckerInstanceStatement:
  case ClassName:
  case ClassSpecifier:
  case ClockingDirection:
  case ClockingPropertyExpr:
  case ClockingSequenceExpr:
  case ClockingSkew:
  case ColonExpressionClause:
  case CompilationUnit:
  case ConcatenationExpression:
  case ConditionalConstraint:
  case ConditionalExpression:
  case ConditionalPattern:
  case ConditionalPredicate:
  case ConditionalPropertyExpr:
  case ConditionalStatement:
  case ConfigCellIdentifier:
  case ConfigInstanceIdentifier:
  case ConfigLiblist:
  case ConfigUseClause:
  case ConstraintBlock:
  case ConstructorName:
  case CopyClassExpression:
  case CoverPropertyStatement:
  case CoverSequenceStatement:
  case CoverageBinsArraySize:
  case CoverageIffClause:
  case CoverageOption:
  case CycleDelay:
  case Declarator:
  case DefParamAssignment:
  case DefaultCaseItem:
  case DefaultConfigRule:
  case DefaultCoverageBinInitializer:
  case DefaultDecayTimeDirective:
switchD_0036f62e_caseD_144:
    SmallVectorBase<slang::ast::Symbol_*>::cleanup
              ((SmallVectorBase<slang::ast::Symbol_*> *)&symbols,(EVP_PKEY_CTX *)pSVar12);
    _Unwind_Resume(puVar5);
  case CheckerInstantiation:
  case ClockingDeclaration:
  case ClockingItem:
  case ContinuousAssign:
  case CoverCross:
  case DefaultClockingReference:
  case DefaultDisableDeclaration:
    goto switchD_0036f62e_caseD_142;
  case ClassDeclaration:
    symbol = (ConfigBlockSymbol *)ClassType::fromSyntax(this,(ClassDeclarationSyntax *)syntax);
    break;
  case ClassMethodDeclaration:
    TVar16 = slang::syntax::SyntaxNode::getLastToken
                       (*(SyntaxNode **)(syntax[5].previewNode[3].parent + 5));
    if (TVar16.kind == NewKeyword) goto switchD_0036f62e_caseD_142;
    symbol = (ConfigBlockSymbol *)
             SubroutineSymbol::fromSyntax
                       (this->compilation,(ClassMethodDeclarationSyntax *)syntax,this);
    goto LAB_0036fcf9;
  case ClassMethodPrototype:
    symbol = (ConfigBlockSymbol *)
             MethodPrototypeSymbol::fromSyntax(this,(ClassMethodPrototypeSyntax *)syntax);
    break;
  case ClassPropertyDeclaration:
    syntax_00 = (ParameterDeclarationStatementSyntax *)syntax[5].previewNode;
    SVar1 = (syntax_00->super_MemberSyntax).super_SyntaxNode.kind;
    if (SVar1 != TypedefDeclaration) {
      if (SVar1 != ForwardTypedefDeclaration) {
        if (SVar1 != ParameterDeclarationStatement) {
          if (SVar1 != DataDeclaration) {
            return;
          }
          symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
               (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
          symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
          symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
          ClassPropertySymbol::fromSyntax
                    (this,(ClassPropertyDeclarationSyntax *)syntax,
                     (SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *)&symbols);
          ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
          lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
          for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
            syntax = *(SyntaxNode **)((long)ppVVar3 + lVar13);
            addMember(this,(Symbol *)syntax);
          }
          SmallVectorBase<const_slang::ast::ClassPropertySymbol_*>::cleanup
                    ((SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *)&symbols,
                     (EVP_PKEY_CTX *)syntax);
          return;
        }
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
             (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
        ParameterSymbolBase::fromLocalSyntax
                  (this,syntax_00,(SmallVectorBase<slang::ast::Symbol_*> *)&symbols);
        ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
        lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
        for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
          syntax_00 = *(ParameterDeclarationStatementSyntax **)((long)ppVVar3 + lVar13);
          addMember(this,(Symbol *)syntax_00);
        }
LAB_0036ff1c:
        SmallVectorBase<slang::ast::Symbol_*>::cleanup
                  ((SmallVectorBase<slang::ast::Symbol_*> *)&symbols,(EVP_PKEY_CTX *)syntax_00);
        return;
      }
      symbol_00 = ForwardingTypedefSymbol::fromSyntax(this,(ClassPropertyDeclarationSyntax *)syntax)
      ;
LAB_0036fbd7:
      addMember(this,&symbol_00->super_Symbol);
      pDVar6 = getOrAddDeferredData(this);
      DeferredMemberData::addForwardingTypedef(pDVar6,symbol_00);
      return;
    }
    symbol = (ConfigBlockSymbol *)
             TypeAliasType::fromSyntax(this,(ClassPropertyDeclarationSyntax *)syntax);
    break;
  case ConcurrentAssertionMember:
    symbol = (ConfigBlockSymbol *)
             ProceduralBlockSymbol::fromSyntax(this,(ConcurrentAssertionMemberSyntax *)syntax);
    break;
  case ConditionalPathDeclaration:
    symbol = (ConfigBlockSymbol *)
             TimingPathSymbol::fromSyntax(this,(ConditionalPathDeclarationSyntax *)syntax);
    break;
  case ConfigDeclaration:
    symbol = Compilation::createConfigBlock
                       (this->compilation,this,(ConfigDeclarationSyntax *)syntax);
    break;
  case ConstraintDeclaration:
    symbol = (ConfigBlockSymbol *)
             ConstraintBlockSymbol::fromSyntax(this,(ConstraintDeclarationSyntax *)syntax);
LAB_0036fcf9:
    if (symbol == (ConfigBlockSymbol *)0x0) {
      return;
    }
    break;
  case ConstraintPrototype:
    symbol = (ConfigBlockSymbol *)
             ConstraintBlockSymbol::fromSyntax(this,(ConstraintPrototypeSyntax *)syntax);
    break;
  case CoverageBins:
    symbol = (ConfigBlockSymbol *)CoverageBinSymbol::fromSyntax(this,(CoverageBinsSyntax *)syntax);
    break;
  case CovergroupDeclaration:
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ = (pointer)0x0;
    symbol_01 = CovergroupType::fromSyntax
                          (this,(CovergroupDeclarationSyntax *)syntax,(Symbol **)&symbols);
    addMember(this,(Symbol *)symbol_01);
    if (symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ == (pointer)0x0) {
      return;
    }
    addMember(this,(Symbol *)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_);
    return;
  case Coverpoint:
    symbol = (ConfigBlockSymbol *)CoverpointSymbol::fromSyntax(this,(CoverpointSyntax *)syntax);
    break;
  case DPIExport:
    Compilation::noteDPIExportDirective(this->compilation,(DPIExportSyntax *)syntax,this);
    return;
  case DPIImport:
    symbol = (ConfigBlockSymbol *)
             SubroutineSymbol::fromSyntax(this->compilation,(DPIImportSyntax *)syntax,this);
    break;
  case DataDeclaration:
    if ((((syntax[5].previewNode)->kind == NamedType) && (syntax[5].parent == (SyntaxNode *)0x0)) &&
       (bVar4 = handleDataDeclaration(this,(DataDeclarationSyntax *)syntax), bVar4)) {
      return;
    }
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
         (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
    VariableSymbol::fromSyntax
              (this->compilation,(DataDeclarationSyntax *)syntax,this,false,
               &symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>);
    ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
    lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
    for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
      syntax = *(SyntaxNode **)((long)ppVVar3 + lVar13);
      addMember(this,(Symbol *)syntax);
    }
LAB_0036fe7f:
    SmallVectorBase<slang::ast::VariableSymbol_*>::cleanup
              (&symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>,(EVP_PKEY_CTX *)syntax);
    return;
  case DefParam:
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
         (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
    symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
    DefParamSymbol::fromSyntax
              (this,(DefParamSyntax *)syntax,
               (SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)&symbols);
    ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
    lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
    for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
      syntax = *(SyntaxNode **)((long)ppVVar3 + lVar13);
      addMember(this,(Symbol *)syntax);
    }
    SmallVectorBase<const_slang::ast::DefParamSymbol_*>::cleanup
              ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)&symbols,
               (EVP_PKEY_CTX *)syntax);
    return;
  default:
    puVar5 = &switchD_0036f5be::switchdataD_004aeac4;
    switch(SVar1) {
    case ExternInterfaceMethod:
      symbol = (ConfigBlockSymbol *)
               MethodPrototypeSymbol::fromSyntax(this,(ExternInterfaceMethodSyntax *)syntax);
      goto LAB_0036f5e7;
    case ExternModuleDecl:
    case ExternUdpDecl:
      Compilation::noteExternDefinition(this->compilation,this,syntax);
      return;
    case FilePathSpec:
    case FirstMatchSequenceExpr:
    case FollowedByPropertyExpr:
    case ForLoopStatement:
    case ForVariableDeclaration:
    case ForeachLoopList:
    case ForeachLoopStatement:
    case ForeverStatement:
    case ForwardTypeRestriction:
    case FunctionPort:
    case FunctionPortList:
    case FunctionPrototype:
    case GreaterThanEqualExpression:
    case GreaterThanExpression:
    case HierarchicalInstance:
      goto switchD_0036f62e_caseD_144;
    case FinalBlock:
switchD_0036f5be_caseD_cf:
      symbol = (ConfigBlockSymbol *)
               ProceduralBlockSymbol::fromSyntax(this,(ProceduralBlockSyntax *)syntax);
      goto LAB_0036f5e7;
    case ForwardTypedefDeclaration:
      symbol_00 = ForwardingTypedefSymbol::fromSyntax
                            (this,(ForwardTypedefDeclarationSyntax *)syntax);
      goto LAB_0036fbd7;
    case FunctionDeclaration:
switchD_0036f5be_caseD_d9:
      pVar15 = SubroutineSymbol::fromSyntax
                         (this->compilation,(FunctionDeclarationSyntax *)syntax,this,false);
      if (pVar15.first != (SubroutineSymbol *)0x0) {
        addMember(this,&(pVar15.first)->super_Symbol);
      }
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pDVar6 = getOrAddDeferredData(this);
        pDVar6->isUncacheable = true;
      }
      break;
    case GenerateBlock:
    case HierarchyInstantiation:
      goto switchD_0036f62e_caseD_142;
    case GenerateRegion:
      pSVar12 = syntax[5].previewNode;
      lVar13 = *(long *)(syntax + 6);
      for (lVar14 = 0; lVar13 << 3 != lVar14; lVar14 = lVar14 + 8) {
        addMembers(this,*(SyntaxNode **)((long)&pSVar12->kind + lVar14));
      }
      break;
    case GenvarDeclaration:
      symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
           (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
      symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
      symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
      GenvarSymbol::fromSyntax
                (this,(GenvarDeclarationSyntax *)syntax,
                 (SmallVectorBase<const_slang::ast::GenvarSymbol_*> *)&symbols);
      ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
      lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
      for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
        syntax = *(SyntaxNode **)((long)ppVVar3 + lVar13);
        addMember(this,(Symbol *)syntax);
      }
      SmallVectorBase<const_slang::ast::GenvarSymbol_*>::cleanup
                ((SmallVectorBase<const_slang::ast::GenvarSymbol_*> *)&symbols,
                 (EVP_PKEY_CTX *)syntax);
      break;
    default:
      puVar5 = &switchD_0036f60e::switchdataD_004aeb48;
      switch(SVar1) {
      case PackageDeclaration:
        symbol = (ConfigBlockSymbol *)
                 Compilation::createPackage
                           (this->compilation,this,(ModuleDeclarationSyntax *)syntax);
        goto LAB_0036f5e7;
      case PackageExportAllDeclaration:
        break;
      case PackageExportDeclaration:
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
        local_58 = *(long *)(syntax + 6) + 1U >> 1;
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ = (pointer)(syntax + 4);
        for (; ((SyntaxNode *)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ !=
                syntax + 4 ||
               (symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len != local_58));
            symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len =
                 symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len + 1) {
          pPVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::
                   iterator_base<const_slang::syntax::PackageImportItemSyntax_*>::dereference
                             ((iterator_base<const_slang::syntax::PackageImportItemSyntax_*> *)
                              &symbols);
          this_00 = &pPVar7->item;
          pCVar2 = this->compilation;
          if ((pPVar7->item).kind == Star) {
            local_68 = parsing::Token::valueText(&pPVar7->package);
            SVar9 = parsing::Token::location(this_00);
            local_48._M_len = (size_t)SVar9;
            pEVar8 = (ExplicitImportSymbol *)
                     BumpAllocator::
                     emplace<slang::ast::WildcardImportSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                               (&pCVar2->super_BumpAllocator,&local_68,(SourceLocation *)&local_48);
            (pEVar8->super_Symbol).originatingSyntax = &pPVar7->super_SyntaxNode;
            Symbol::setAttributes
                      ((Symbol *)pEVar8,this,
                       *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                         *)&syntax[2].previewNode);
            psVar10 = &pEVar8->importName;
          }
          else {
            local_68 = parsing::Token::valueText(&pPVar7->package);
            local_48 = parsing::Token::valueText(this_00);
            local_50 = parsing::Token::location(this_00);
            pEVar8 = BumpAllocator::
                     emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                               (&pCVar2->super_BumpAllocator,&local_68,&local_48,&local_50);
            (pEVar8->super_Symbol).originatingSyntax = &pPVar7->super_SyntaxNode;
            Symbol::setAttributes
                      (&pEVar8->super_Symbol,this,
                       *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                         *)&syntax[2].previewNode);
            psVar10 = (string_view *)&pEVar8->isFromExport;
          }
          *(bool *)&psVar10->_M_len = true;
          addMember(this,&pEVar8->super_Symbol);
        }
        break;
      case PackageHeader:
      case PackageImportItem:
      case ParallelBlockStatement:
      case ParameterDeclaration:
        goto switchD_0036f62e_caseD_144;
      case PackageImportDeclaration:
        pSVar12 = syntax + 4;
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
        local_58 = *(long *)(syntax + 6) + 1U >> 1;
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ = (pointer)pSVar12;
        local_38 = pSVar12;
        for (; ((SyntaxNode *)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ !=
                pSVar12 ||
               (symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len != local_58));
            symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len =
                 symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len + 1) {
          pPVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::
                   iterator_base<const_slang::syntax::PackageImportItemSyntax_*>::dereference
                             ((iterator_base<const_slang::syntax::PackageImportItemSyntax_*> *)
                              &symbols);
          if ((pPVar7->item).kind == Star) {
            addWildcardImport(this,pPVar7,
                              *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                *)&syntax[2].previewNode);
          }
          else {
            pCVar2 = this->compilation;
            local_68 = parsing::Token::valueText(&pPVar7->package);
            local_48 = parsing::Token::valueText(&pPVar7->item);
            local_50 = parsing::Token::location(&pPVar7->item);
            pEVar8 = BumpAllocator::
                     emplace<slang::ast::ExplicitImportSymbol,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                               (&pCVar2->super_BumpAllocator,&local_68,&local_48,&local_50);
            (pEVar8->super_Symbol).originatingSyntax = &pPVar7->super_SyntaxNode;
            Symbol::setAttributes
                      (&pEVar8->super_Symbol,this,
                       *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                         *)&syntax[2].previewNode);
            pSVar12 = local_38;
            addMember(this,&pEVar8->super_Symbol);
          }
        }
        break;
      case ParameterDeclarationStatement:
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
             (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
        symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
        ParameterSymbolBase::fromLocalSyntax
                  (this,(ParameterDeclarationStatementSyntax *)syntax,
                   (SmallVectorBase<slang::ast::Symbol_*> *)&symbols);
        ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
        lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
        syntax_00 = (ParameterDeclarationStatementSyntax *)syntax;
        for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
          syntax_00 = *(ParameterDeclarationStatementSyntax **)((long)ppVVar3 + lVar13);
          addMember(this,(Symbol *)syntax_00);
        }
        goto LAB_0036ff1c;
      default:
        if (3 < SVar1 - AlwaysBlock) {
          puVar5 = &switchD_0036f62e::switchdataD_004aeb28;
          switch(SVar1) {
          case NetAlias:
          case NonAnsiPortList:
            goto switchD_0036f62e_caseD_142;
          case NetDeclaration:
            symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
                 (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.firstElement;
            symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
            symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
            NetSymbol::fromSyntax
                      (this,(NetDeclarationSyntax *)syntax,
                       (SmallVectorBase<const_slang::ast::NetSymbol_*> *)&symbols);
            ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
            lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
            for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
              syntax = *(SyntaxNode **)((long)ppVVar3 + lVar13);
              addMember(this,(Symbol *)syntax);
            }
            SmallVectorBase<const_slang::ast::NetSymbol_*>::cleanup
                      ((SmallVectorBase<const_slang::ast::NetSymbol_*> *)&symbols,
                       (EVP_PKEY_CTX *)syntax);
            return;
          case NetPortHeader:
          case NewArrayExpression:
          case NewClassExpression:
          case NoUnconnectedDriveDirective:
            goto switchD_0036f62e_caseD_144;
          case NetTypeDeclaration:
            symbol = (ConfigBlockSymbol *)
                     NetType::fromSyntax(this,(NetTypeDeclarationSyntax *)syntax);
            goto LAB_0036f5e7;
          }
          if (SVar1 == AnonymousProgram) {
            symbol = (ConfigBlockSymbol *)
                     AnonymousProgramSymbol::fromSyntax(this,(AnonymousProgramSyntax *)syntax);
            goto LAB_0036f5e7;
          }
          if ((SVar1 == AnsiPortList) || (SVar1 == BindDirective)) goto switchD_0036f62e_caseD_142;
          if (SVar1 == BinsSelection) {
            symbol = (ConfigBlockSymbol *)
                     CoverageBinSymbol::fromSyntax(this,(BinsSelectionSyntax *)syntax);
            goto LAB_0036f5e7;
          }
          if (SVar1 == CaseGenerate) goto switchD_0036f62e_caseD_142;
          if (SVar1 == ElabSystemTask) {
            symbol = (ConfigBlockSymbol *)
                     ElabSystemTaskSymbol::fromSyntax
                               ((ElabSystemTaskSymbol *)this->compilation,(Compilation *)syntax,
                                in_RDX);
            goto LAB_0036f5e7;
          }
          if (SVar1 == EmptyMember) {
            symbol = (ConfigBlockSymbol *)
                     EmptyMemberSymbol::fromSyntax
                               (this->compilation,this,(EmptyMemberSyntax *)syntax);
            goto LAB_0036f5e7;
          }
          if (SVar1 == EnumType) {
            addDeferredMembers(this,syntax);
            pDVar6 = getOrAddDeferredData(this);
            pDVar6->hasEnums = true;
            return;
          }
          if (SVar1 == IfGenerate) goto switchD_0036f62e_caseD_142;
          if (SVar1 == IfNonePathDeclaration) {
            symbol = (ConfigBlockSymbol *)
                     TimingPathSymbol::fromSyntax(this,(IfNonePathDeclarationSyntax *)syntax);
            goto LAB_0036f5e7;
          }
          if (SVar1 == ImmediateAssertionMember) {
            symbol = (ConfigBlockSymbol *)
                     ProceduralBlockSymbol::fromSyntax
                               (this,(ImmediateAssertionMemberSyntax *)syntax);
            goto LAB_0036f5e7;
          }
          if (SVar1 != InitialBlock) {
            if (SVar1 != InterfaceDeclaration) {
              if (SVar1 == LetDeclaration) {
                symbol = (ConfigBlockSymbol *)
                         LetDeclSymbol::fromSyntax(this,(LetDeclarationSyntax *)syntax);
                goto LAB_0036f5e7;
              }
              if (SVar1 == LibraryDeclaration) {
                return;
              }
              if (SVar1 == LibraryIncludeStatement) {
                return;
              }
              if ((SVar1 == LoopGenerate) || (SVar1 == ModportDeclaration))
              goto switchD_0036f62e_caseD_142;
              if (SVar1 != ModuleDeclaration) {
                if (SVar1 == PathDeclaration) {
                  symbol = (ConfigBlockSymbol *)
                           TimingPathSymbol::fromSyntax(this,(PathDeclarationSyntax *)syntax);
                  goto LAB_0036f5e7;
                }
                if (SVar1 == PortDeclaration) {
                  addDeferredMembers(this,syntax);
                  pDVar6 = getOrAddDeferredData(this);
                  DeferredMemberData::addPortDeclaration(pDVar6,syntax,this->lastMember);
                  return;
                }
                if (SVar1 == PrimitiveInstantiation) goto switchD_0036f62e_caseD_142;
                if (SVar1 == WildcardPortList) {
                  return;
                }
                if (SVar1 == PropertyDeclaration) {
                  symbol = (ConfigBlockSymbol *)
                           PropertySymbol::fromSyntax(this,(PropertyDeclarationSyntax *)syntax);
                  goto LAB_0036f5e7;
                }
                if (SVar1 == PulseStyleDeclaration) {
                  symbol = (ConfigBlockSymbol *)
                           PulseStyleSymbol::fromSyntax(this,(PulseStyleDeclarationSyntax *)syntax);
                  goto LAB_0036f5e7;
                }
                if (SVar1 == SequenceDeclaration) {
                  symbol = (ConfigBlockSymbol *)
                           SequenceSymbol::fromSyntax(this,(SequenceDeclarationSyntax *)syntax);
                  goto LAB_0036f5e7;
                }
                if (SVar1 == SpecifyBlock) goto switchD_0036f62e_caseD_142;
                if (SVar1 == SpecparamDeclaration) {
                  symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_ =
                       (pointer)symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.
                                firstElement;
                  symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len = 0;
                  symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.cap = 5;
                  SpecparamSymbol::fromSyntax
                            (this,(SpecparamDeclarationSyntax *)syntax,
                             (SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *)&symbols);
                  ppVVar3 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.data_;
                  lVar14 = symbols.super_SmallVectorBase<slang::ast::VariableSymbol_*>.len << 3;
                  for (lVar13 = 0; lVar14 != lVar13; lVar13 = lVar13 + 8) {
                    syntax = *(SyntaxNode **)((long)ppVVar3 + lVar13);
                    addMember(this,(Symbol *)syntax);
                  }
                  SmallVectorBase<const_slang::ast::SpecparamSymbol_*>::cleanup
                            ((SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *)&symbols,
                             (EVP_PKEY_CTX *)syntax);
                  return;
                }
                if (SVar1 == SystemTimingCheck) {
                  symbol = (ConfigBlockSymbol *)
                           SystemTimingCheckSymbol::fromSyntax
                                     (this,(SystemTimingCheckSyntax *)syntax);
                  goto LAB_0036f5e7;
                }
                if (SVar1 == TaskDeclaration) goto switchD_0036f5be_caseD_d9;
                if (SVar1 == TimeUnitsDeclaration) {
                  return;
                }
                if (SVar1 == TypedefDeclaration) {
                  symbol = (ConfigBlockSymbol *)
                           TypeAliasType::fromSyntax(this,(TypedefDeclarationSyntax *)syntax);
                  goto LAB_0036f5e7;
                }
                if (SVar1 == UdpDeclaration) {
                  Compilation::createPrimitive
                            (this->compilation,this,(UdpDeclarationSyntax *)syntax);
                  return;
                }
                if (SVar1 == UserDefinedNetDeclaration) {
                  handleUserDefinedNet(this,(UserDefinedNetDeclarationSyntax *)syntax);
                  return;
                }
              }
            }
            if (this->lastMember == (Symbol *)0x0) {
              uVar11 = 1;
            }
            else {
              uVar11 = (ulong)(this->lastMember->indexInScope + 1);
            }
            location._8_8_ = uVar11;
            location.scope = this;
            Compilation::createDefinition
                      (this->compilation,this,location,(ModuleDeclarationSyntax *)syntax);
            if ((this->thisSym->kind | Definition) == CompilationUnit) {
              return;
            }
            if (syntax->kind == InterfaceDeclaration) {
              return;
            }
switchD_0036f62e_caseD_142:
            addDeferredMembers(this,syntax);
            return;
          }
        }
        goto switchD_0036f5be_caseD_cf;
      }
    }
    return;
  }
LAB_0036f5e7:
  addMember(this,&symbol->super_Symbol);
  return;
}

Assistant:

void Scope::addMembers(const SyntaxNode& syntax) {
    if (syntax.previewNode)
        addMembers(*syntax.previewNode);

    switch (syntax.kind) {
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ProgramDeclaration: {
            // Definitions exist in their own namespace and are tracked in the Compilation.
            LookupLocation ll(this, lastMember ? uint32_t(lastMember->getIndex()) + 1 : 1);
            compilation.createDefinition(*this, ll, syntax.as<ModuleDeclarationSyntax>());

            if (thisSym->kind != SymbolKind::Root && thisSym->kind != SymbolKind::CompilationUnit &&
                syntax.kind != SyntaxKind::InterfaceDeclaration) {
                addDeferredMembers(syntax);
            }
            break;
        }
        case SyntaxKind::PackageDeclaration: {
            // Packages exist in their own namespace and are tracked in the Compilation.
            auto& package = compilation.createPackage(*this, syntax.as<ModuleDeclarationSyntax>());
            addMember(package);
            break;
        }
        case SyntaxKind::UdpDeclaration:
            // Primitives exist in their own namespace and are tracked in the Compilation.
            compilation.createPrimitive(*this, syntax.as<UdpDeclarationSyntax>());
            break;
        case SyntaxKind::ConfigDeclaration:
            // Config blocks exist in their own namespace and are tracked in the Compilation.
            addMember(compilation.createConfigBlock(*this, syntax.as<ConfigDeclarationSyntax>()));
            break;
        case SyntaxKind::PackageImportDeclaration: {
            auto& importDecl = syntax.as<PackageImportDeclarationSyntax>();
            for (auto item : importDecl.items) {
                if (item->item.kind == TokenKind::Star) {
                    addWildcardImport(*item, importDecl.attributes);
                }
                else {
                    auto import = compilation.emplace<ExplicitImportSymbol>(
                        item->package.valueText(), item->item.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, importDecl.attributes);
                    addMember(*import);
                }
            }
            break;
        }
        case SyntaxKind::PackageExportDeclaration: {
            auto& exportDecl = syntax.as<PackageExportDeclarationSyntax>();
            for (auto item : exportDecl.items) {
                if (item->item.kind == TokenKind::Star) {
                    // These are handled manually as "wildcard imports" but don't get
                    // added to the import list. This is done just so that the package
                    // name itself gets validated and the attributes have somewhere to live.
                    // The actual export functionality is handled in PackageSymbol.
                    auto import = compilation.emplace<WildcardImportSymbol>(
                        item->package.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, exportDecl.attributes);
                    import->isFromExport = true;
                    addMember(*import);
                }
                else {
                    auto import = compilation.emplace<ExplicitImportSymbol>(
                        item->package.valueText(), item->item.valueText(), item->item.location());

                    import->setSyntax(*item);
                    import->setAttributes(*this, exportDecl.attributes);
                    import->isFromExport = true;
                    addMember(*import);
                }
            }
            break;
        }
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::PrimitiveInstantiation:
        case SyntaxKind::CheckerInstantiation:
        case SyntaxKind::AnsiPortList:
        case SyntaxKind::NonAnsiPortList:
        case SyntaxKind::IfGenerate:
        case SyntaxKind::CaseGenerate:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::GenerateBlock:
        case SyntaxKind::ContinuousAssign:
        case SyntaxKind::ModportDeclaration:
        case SyntaxKind::ClockingItem:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
        case SyntaxKind::SpecifyBlock:
        case SyntaxKind::CoverCross:
        case SyntaxKind::NetAlias:
        case SyntaxKind::BindDirective:
        case SyntaxKind::ClockingDeclaration:
            addDeferredMembers(syntax);
            break;
        case SyntaxKind::EnumType:
            addDeferredMembers(syntax);
            getOrAddDeferredData().hasEnums = true;
            break;
        case SyntaxKind::PortDeclaration:
            addDeferredMembers(syntax);
            getOrAddDeferredData().addPortDeclaration(syntax, lastMember);
            break;
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration: {
            auto [subroutine, isExternIfaceMethod] = SubroutineSymbol::fromSyntax(
                compilation, syntax.as<FunctionDeclarationSyntax>(), *this, /* outOfBlock */ false);

            if (subroutine)
                addMember(*subroutine);

            if (isExternIfaceMethod)
                getOrAddDeferredData().isUncacheable = true;
            break;
        }
        case SyntaxKind::DataDeclaration: {
            // If this declaration has a named type we need to do a lookup here to see if it's
            // actually a user-defined nettype or a non-ansi interface port declaration.
            auto& dataDecl = syntax.as<DataDeclarationSyntax>();
            if (dataDecl.type->kind == SyntaxKind::NamedType && dataDecl.modifiers.empty()) {
                if (handleDataDeclaration(dataDecl))
                    break;
            }

            SmallVector<VariableSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, dataDecl, *this, /* isCheckerFreeVar */ false,
                                       symbols);
            for (auto symbol : symbols)
                addMember(*symbol);
            break;
        }
        case SyntaxKind::UserDefinedNetDeclaration:
            handleUserDefinedNet(syntax.as<UserDefinedNetDeclarationSyntax>());
            break;
        case SyntaxKind::NetDeclaration: {
            SmallVector<const NetSymbol*> nets;
            NetSymbol::fromSyntax(*this, syntax.as<NetDeclarationSyntax>(), nets);
            for (auto net : nets)
                addMember(*net);
            break;
        }
        case SyntaxKind::CheckerDataDeclaration: {
            SmallVector<VariableSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, *syntax.as<CheckerDataDeclarationSyntax>().data,
                                       *this, /* isCheckerFreeVar */ true, symbols);
            for (auto symbol : symbols)
                addMember(*symbol);
            break;
        }
        case SyntaxKind::ParameterDeclarationStatement: {
            SmallVector<Symbol*> params;
            ParameterSymbolBase::fromLocalSyntax(*this,
                                                 syntax.as<ParameterDeclarationStatementSyntax>(),
                                                 params);
            for (auto param : params)
                addMember(*param);
            break;
        }
        case SyntaxKind::AlwaysBlock:
        case SyntaxKind::AlwaysCombBlock:
        case SyntaxKind::AlwaysLatchBlock:
        case SyntaxKind::AlwaysFFBlock:
        case SyntaxKind::InitialBlock:
        case SyntaxKind::FinalBlock:
            addMember(ProceduralBlockSymbol::fromSyntax(*this, syntax.as<ProceduralBlockSyntax>()));
            break;
        case SyntaxKind::ConcurrentAssertionMember:
            addMember(ProceduralBlockSymbol::fromSyntax(
                *this, syntax.as<ConcurrentAssertionMemberSyntax>()));
            break;
        case SyntaxKind::ImmediateAssertionMember:
            addMember(ProceduralBlockSymbol::fromSyntax(
                *this, syntax.as<ImmediateAssertionMemberSyntax>()));
            break;
        case SyntaxKind::EmptyMember:
            addMember(
                EmptyMemberSymbol::fromSyntax(compilation, *this, syntax.as<EmptyMemberSyntax>()));
            break;
        case SyntaxKind::TypedefDeclaration:
            addMember(TypeAliasType::fromSyntax(*this, syntax.as<TypedefDeclarationSyntax>()));
            break;
        case SyntaxKind::ForwardTypedefDeclaration: {
            auto& symbol = ForwardingTypedefSymbol::fromSyntax(
                *this, syntax.as<ForwardTypedefDeclarationSyntax>());
            addMember(symbol);
            getOrAddDeferredData().addForwardingTypedef(symbol);
            break;
        }
        case SyntaxKind::GenerateRegion:
            for (auto member : syntax.as<GenerateRegionSyntax>().members)
                addMembers(*member);
            break;
        case SyntaxKind::NetTypeDeclaration:
            addMember(NetType::fromSyntax(*this, syntax.as<NetTypeDeclarationSyntax>()));
            break;
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::PackageExportAllDeclaration:
            // These are handled elsewhere; just ignore here.
            break;
        case SyntaxKind::GenvarDeclaration: {
            SmallVector<const GenvarSymbol*> genvars;
            GenvarSymbol::fromSyntax(*this, syntax.as<GenvarDeclarationSyntax>(), genvars);
            for (auto genvar : genvars)
                addMember(*genvar);
            break;
        }
        case SyntaxKind::ClassDeclaration:
            addMember(ClassType::fromSyntax(*this, syntax.as<ClassDeclarationSyntax>()));
            break;
        case SyntaxKind::ClassPropertyDeclaration: {
            auto& cpd = syntax.as<ClassPropertyDeclarationSyntax>();
            switch (cpd.declaration->kind) {
                case SyntaxKind::DataDeclaration: {
                    SmallVector<const ClassPropertySymbol*> symbols;
                    ClassPropertySymbol::fromSyntax(*this, cpd, symbols);
                    for (auto symbol : symbols)
                        addMember(*symbol);
                    break;
                }
                case SyntaxKind::TypedefDeclaration:
                    addMember(TypeAliasType::fromSyntax(*this, cpd));
                    break;
                case SyntaxKind::ForwardTypedefDeclaration: {
                    auto& symbol = ForwardingTypedefSymbol::fromSyntax(*this, cpd);
                    addMember(symbol);
                    getOrAddDeferredData().addForwardingTypedef(symbol);
                    break;
                }
                case SyntaxKind::ParameterDeclarationStatement: {
                    SmallVector<Symbol*> params;
                    ParameterSymbolBase::fromLocalSyntax(
                        *this, cpd.declaration->as<ParameterDeclarationStatementSyntax>(), params);
                    for (auto param : params)
                        addMember(*param);
                    break;
                }
                default:
                    // All other possible member kinds here are illegal and will
                    // be diagnosed in the parser, so just ignore them.
                    break;
            }
            break;
        }
        case SyntaxKind::ClassMethodDeclaration: {
            // Constructors need to be deferred because they may need to
            // inherit arguments from their base class.
            auto& cmds = syntax.as<ClassMethodDeclarationSyntax>();
            if (cmds.declaration->prototype->name->getLastToken().kind == TokenKind::NewKeyword)
                addDeferredMembers(syntax);
            else if (auto subroutine = SubroutineSymbol::fromSyntax(compilation, cmds, *this))
                addMember(*subroutine);
            break;
        }
        case SyntaxKind::ClassMethodPrototype:
            addMember(
                MethodPrototypeSymbol::fromSyntax(*this, syntax.as<ClassMethodPrototypeSyntax>()));
            break;
        case SyntaxKind::ElabSystemTask:
            addMember(
                ElabSystemTaskSymbol::fromSyntax(compilation, syntax.as<ElabSystemTaskSyntax>()));
            break;
        case SyntaxKind::DPIImport:
            addMember(
                SubroutineSymbol::fromSyntax(compilation, syntax.as<DPIImportSyntax>(), *this));
            break;
        case SyntaxKind::DPIExport:
            compilation.noteDPIExportDirective(syntax.as<DPIExportSyntax>(), *this);
            break;
        case SyntaxKind::ConstraintDeclaration:
            if (auto sym = ConstraintBlockSymbol::fromSyntax(
                    *this, syntax.as<ConstraintDeclarationSyntax>())) {
                addMember(*sym);
            }
            break;
        case SyntaxKind::ConstraintPrototype:
            addMember(
                ConstraintBlockSymbol::fromSyntax(*this, syntax.as<ConstraintPrototypeSyntax>()));
            break;
        case SyntaxKind::DefParam: {
            SmallVector<const DefParamSymbol*> defparams;
            DefParamSymbol::fromSyntax(*this, syntax.as<DefParamSyntax>(), defparams);
            for (auto defparam : defparams)
                addMember(*defparam);
            break;
        }
        case SyntaxKind::SpecparamDeclaration: {
            SmallVector<const SpecparamSymbol*> params;
            SpecparamSymbol::fromSyntax(*this, syntax.as<SpecparamDeclarationSyntax>(), params);
            for (auto param : params)
                addMember(*param);
            break;
        }
        case SyntaxKind::SequenceDeclaration:
            addMember(SequenceSymbol::fromSyntax(*this, syntax.as<SequenceDeclarationSyntax>()));
            break;
        case SyntaxKind::PropertyDeclaration:
            addMember(PropertySymbol::fromSyntax(*this, syntax.as<PropertyDeclarationSyntax>()));
            break;
        case SyntaxKind::LetDeclaration:
            addMember(LetDeclSymbol::fromSyntax(*this, syntax.as<LetDeclarationSyntax>()));
            break;
        case SyntaxKind::CheckerDeclaration:
            addMember(CheckerSymbol::fromSyntax(*this, syntax.as<CheckerDeclarationSyntax>()));
            break;
        case SyntaxKind::CovergroupDeclaration: {
            const Symbol* classProperty = nullptr;
            addMember(CovergroupType::fromSyntax(*this, syntax.as<CovergroupDeclarationSyntax>(),
                                                 classProperty));
            if (classProperty)
                addMember(*classProperty);
            break;
        }
        case SyntaxKind::Coverpoint:
            addMember(CoverpointSymbol::fromSyntax(*this, syntax.as<CoverpointSyntax>()));
            break;
        case SyntaxKind::CoverageBins:
            addMember(CoverageBinSymbol::fromSyntax(*this, syntax.as<CoverageBinsSyntax>()));
            break;
        case SyntaxKind::BinsSelection:
            addMember(CoverageBinSymbol::fromSyntax(*this, syntax.as<BinsSelectionSyntax>()));
            break;
        case SyntaxKind::ExternInterfaceMethod:
            addMember(
                MethodPrototypeSymbol::fromSyntax(*this, syntax.as<ExternInterfaceMethodSyntax>()));
            break;
        case SyntaxKind::PathDeclaration:
            addMember(TimingPathSymbol::fromSyntax(*this, syntax.as<PathDeclarationSyntax>()));
            break;
        case SyntaxKind::IfNonePathDeclaration:
            addMember(
                TimingPathSymbol::fromSyntax(*this, syntax.as<IfNonePathDeclarationSyntax>()));
            break;
        case SyntaxKind::ConditionalPathDeclaration:
            addMember(
                TimingPathSymbol::fromSyntax(*this, syntax.as<ConditionalPathDeclarationSyntax>()));
            break;
        case SyntaxKind::PulseStyleDeclaration:
            addMember(
                PulseStyleSymbol::fromSyntax(*this, syntax.as<PulseStyleDeclarationSyntax>()));
            break;
        case SyntaxKind::SystemTimingCheck:
            addMember(
                SystemTimingCheckSymbol::fromSyntax(*this, syntax.as<SystemTimingCheckSyntax>()));
            break;
        case SyntaxKind::AnonymousProgram:
            addMember(
                AnonymousProgramSymbol::fromSyntax(*this, syntax.as<AnonymousProgramSyntax>()));
            break;
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
            compilation.noteExternDefinition(*this, syntax);
            break;
        case SyntaxKind::WildcardPortList:
            // If we hit this case we've run into an error elsewhere.
            // Just silently ignore it here.
            break;
        case SyntaxKind::LibraryDeclaration:
        case SyntaxKind::LibraryIncludeStatement:
            // These are ignored here, they're only processed during
            // library map construction.
            break;
        default:
            SLANG_UNREACHABLE;
    }
}